

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_tags_t<cfgfile::string_trait_t>::tag_tags_t
          (tag_tags_t<cfgfile::string_trait_t> *this,string_t *name,bool is_mandatory)

{
  byte in_DL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc50;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffc58;
  allocator *paVar1;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_stack_fffffffffffffc60;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined8 in_stack_fffffffffffffc98;
  undefined1 is_mandatory_00;
  allocator *paVar2;
  string_t *in_stack_fffffffffffffca0;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffca8;
  tag_custom_t<cfgfile::string_trait_t> *in_stack_fffffffffffffcb0;
  undefined1 is_mandatory_01;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd18;
  tag_scalar_vector_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd20;
  allocator local_2b9;
  string local_2b8 [39];
  allocator in_stack_fffffffffffffd6f;
  string_t *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  tag_bool_scalar_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd80;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd88;
  tag_int_scalar_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd90;
  string local_268 [32];
  string local_248 [39];
  allocator in_stack_fffffffffffffddf;
  string_t *in_stack_fffffffffffffde0;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffde8;
  tag_string_scalar_t<cfgfile::string_trait_t> *in_stack_fffffffffffffdf0;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [36];
  undefined4 local_104;
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  
  is_mandatory_00 = (undefined1)((ulong)in_stack_fffffffffffffc98 >> 0x38);
  local_11 = in_DL & 1;
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffc60,
             (string_t *)in_stack_fffffffffffffc58,SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0)
            );
  *in_RDI = &PTR__tag_tags_t_001797d0;
  is_mandatory_01 = (undefined1)((ulong)(in_RDI + 0xc) >> 0x38);
  paVar1 = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"string_field",paVar1);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                 (string_t *)in_stack_fffffffffffffc50,(bool)in_stack_fffffffffffffc4f);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::constraint_one_of_t(in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"no_value_field",&local_b1);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,(string_t *)in_stack_fffffffffffffc50,
             (bool)in_stack_fffffffffffffc4f);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"int_field",&local_f9);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::tag_scalar_vector_t
            ((tag_scalar_vector_t<int,_cfgfile::string_trait_t> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,(string_t *)in_stack_fffffffffffffc50,
             (bool)in_stack_fffffffffffffc4f);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_100 = 0;
  local_104 = 500;
  cfgfile::constraint_min_max_t<int>::constraint_min_max_t
            ((constraint_min_max_t<int> *)in_stack_fffffffffffffc60,(int *)in_stack_fffffffffffffc58
             ,(int *)in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"custom_field",&local_149);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  tag_custom_t<cfgfile::string_trait_t>::tag_custom_t
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (bool)is_mandatory_00);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"bool_scalar",&local_191);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  tag_bool_scalar_t<cfgfile::string_trait_t>::tag_bool_scalar_t
            (in_stack_fffffffffffffd80,
             (tag_t<cfgfile::string_trait_t> *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),in_stack_fffffffffffffd70
             ,(bool)in_stack_fffffffffffffd6f);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  paVar2 = &local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"int_scalar",paVar2);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (string_t *)in_stack_fffffffffffffd80,(bool)in_stack_fffffffffffffd7f);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  paVar2 = (allocator *)&stack0xfffffffffffffddf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffde0,"string_scalar",paVar2);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  tag_string_scalar_t<cfgfile::string_trait_t>::tag_string_scalar_t
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (bool)in_stack_fffffffffffffddf);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"int_scalar_vector",(allocator *)&stack0xfffffffffffffd97);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  tag_scalar_vector_t<cfgfile::string_trait_t>::tag_scalar_vector_t
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(string_t *)paVar1,
             (bool)is_mandatory_01);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd97);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffd70,"one",(allocator *)&stack0xfffffffffffffd6f);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffc60,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_fffffffffffffc58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
  this_00 = (constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 0x1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"two",&local_2b9);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  paVar1 = (allocator *)&stack0xfffffffffffffd1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd20,"three",paVar1);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd1f);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::set_constraint((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                    *)(in_RDI + 0xc),
                   (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(in_RDI + 0x1d));
  cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::set_constraint
            ((tag_scalar_vector_t<int,_cfgfile::string_trait_t> *)(in_RDI + 0x30),
             (constraint_t<int> *)(in_RDI + 0x40));
  return;
}

Assistant:

tag_tags_t( const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_no_value_t< Trait >( name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
		,	m_no_value_field( *this, Trait::from_ascii( "no_value_field" ), true )
		,	m_int_field( *this, Trait::from_ascii( "int_field" ), true )
		,	m_int_field_constraint( 0, 500 )
		,	m_custom_field( *this, Trait::from_ascii( "custom_field" ), true )
		,	m_bool_scalar( *this, Trait::from_ascii( "bool_scalar" ), true )
		,	m_int_scalar( *this, Trait::from_ascii( "int_scalar" ), true )
		,	m_string_scalar( *this, Trait::from_ascii( "string_scalar" ), true )
		,	m_int_scalar_vector( *this, Trait::from_ascii( "int_scalar_vector" ), true )
	{
		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

		m_int_field.set_constraint( &m_int_field_constraint );

	}